

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMixedMeshControl::CreateSkeleton(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int dimension;
  TPZGeoEl *pTVar2;
  int64_t skeleton;
  int iVar3;
  TPZGeoEl **ppTVar4;
  TPZCompEl *cel;
  long *plVar5;
  _Base_ptr p_Var6;
  undefined8 uVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  TPZCompMesh *pTVar11;
  _Self __tmp;
  _Self __tmp_2;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  subels;
  _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  local_60;
  
  pTVar11 = ((this->fFluxMesh).fRef)->fPointer;
  dimension = pTVar11->fDimModel;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&pTVar11->fCreate,dimension);
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  iVar3 = (this->super_TPZMHMeshControl).fpOrderSkeleton;
  iVar10 = 1;
  if (1 < iVar3) {
    iVar10 = iVar3;
  }
  pTVar11 = ((this->fFluxMesh).fRef)->fPointer;
  pTVar11->fDefaultOrder = iVar10;
  p_Var6 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      if (*(_Base_ptr *)(p_Var6 + 1) == p_Var6[1]._M_left) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x404);
      }
      ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,(int64_t)*(_Base_ptr *)(p_Var6 + 1)
                          );
      pTVar2 = *ppTVar4;
      pTVar11 = ((this->fFluxMesh).fRef)->fPointer;
      cel = TPZCreateApproximationSpace::CreateCompEl(&pTVar11->fCreate,pTVar2,pTVar11);
      iVar3 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
      if (cel == (TPZCompEl *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(cel,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0)
        ;
      }
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,cel,-1);
      (**(code **)(*plVar5 + 0x2f8))
                (plVar5,iVar3 + -1,
                 (uint)((long)p_Var6[1]._M_parent < (long)p_Var6[1]._M_left) * 2 + -1);
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,cel,-1);
      pTVar2->fReference = (TPZCompEl *)0x0;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    pTVar11 = ((this->fFluxMesh).fRef)->fPointer;
  }
  TPZCompMesh::LoadReferences(pTVar11);
  p_Var9 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  do {
    if ((_Rb_tree_header *)p_Var9 == p_Var1) {
      (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
      ((this->fFluxMesh).fRef)->fPointer->fDimModel = dimension;
      return;
    }
    skeleton = *(int64_t *)(p_Var9 + 1);
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    TPZMHMeshControl::ConnectedElements
              (&this->super_TPZMHMeshControl,skeleton,(pair<long,_long> *)&p_Var9[1]._M_parent,
               (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)&local_60);
    ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZGeoEl_*,_10>,skeleton);
    pTVar2 = *ppTVar4;
    (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
    if (pTVar2->fReference == (TPZCompEl *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = __dynamic_cast(pTVar2->fReference,&TPZCompEl::typeinfo,
                             &TPZInterpolatedElement::typeinfo);
    }
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        p_Var6 = (_Base_ptr)&p_Var8[1]._M_parent;
        while (p_Var6 = *(_Base_ptr *)p_Var6, p_Var6 != (_Base_ptr)&p_Var8[1]._M_parent) {
          if ((p_Var6->_M_left == (_Base_ptr)0x0) ||
             (plVar5 = (long *)__dynamic_cast(p_Var6->_M_left,&TPZCompEl::typeinfo,
                                              &TPZInterpolatedElement::typeinfo,0),
             plVar5 == (long *)0x0)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                       ,0x459);
          }
          (**(code **)(*plVar5 + 0x350))(plVar5,*(undefined4 *)&p_Var6->_M_right,uVar7);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    std::
    _Rb_tree<long,_std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>,_std::_Select1st<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
    ::~_Rb_tree(&local_60);
  } while( true );
}

Assistant:

void TPZMHMixedMeshControl::CreateSkeleton()
{
    // comment this line or not to switch the type of skeleton elements
    int meshdim = fFluxMesh->Dimension();
    fFluxMesh->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    fGMesh->ResetReference();
    int order = fpOrderSkeleton;
    if (order <= 0) {
        order = 1;
    }
    // create the skeleton elements without applying the restraints of the elements of the subdomains
    fFluxMesh->SetDefaultOrder(order);
    std::map<int64_t, std::pair<int64_t, int64_t> >::iterator it = fInterfaces.begin();
    while (it != fInterfaces.end()) {
        int64_t elindex = it->first;

        if (elindex == it->second.second) {
            DebugStop();
            // boundary elements shouldn't be in fInterface map. they are removed from the map in method
            // TPZMHMixedMeshControl::AdjustBoundaryElements
        }
        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        // create an element to model the flux between subdomains
        TPZCompEl *cel = fFluxMesh->CreateCompEl(gel);
//        TPZCompEl *cel = fFluxMesh->ElementVec()[index];
        int Side = gel->NSides()-1;
        TPZInterpolationSpace *intel = dynamic_cast<TPZInterpolationSpace *>(cel);
        SetSubdomain(cel, -1);

        if (it->second.first < it->second.second) {
          // set the flux orientation depending on the relative value of the
          // element ids
          intel->SetSideOrient(Side, 1);
        } else {
          intel->SetSideOrient(Side, -1);
        }
        // this element will not be put in a subdomain
        SetSubdomain(cel, -1);
        gel->ResetReference();

        it++;
    }
    // Apply restraints to the element/sides and the skeleton
    fFluxMesh->LoadReferences();
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out("FluxBeforeInterfaces.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(fFluxMesh.operator->(), out);
    }
#endif
#ifdef PZDEBUG
    // verify if any connect is restrained
    {
        int64_t nconnects = fFluxMesh->NConnects();
        for (int64_t ic = 0; ic<nconnects; ic++) {
            TPZConnect &c = fFluxMesh->ConnectVec()[ic];
            if (c.HasDependency()) {
                std::cout << "Connect index " << ic << " Has dependency\n";
            }
        }
    }
#endif
    it = fInterfaces.begin();
    while (it != fInterfaces.end()) {
        // the index of the map of the interface data structure is the index of the geometric element
        int64_t elindex = it->first;

        // data structure containing the list of connected elements by subdomain
        std::map<int64_t,std::list<TPZCompElSide> > subels;
        // find the connected computational elements in function of the index of the geometric element
        ConnectedElements(elindex, it->second, subels);

#ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Interface elindex " << elindex << " left " << it->second.first << " right " << it->second.second << std::endl;
            sout << "Number of connected subdomains " << subels.size() << std::endl;
            for (std::map<int64_t,std::list<TPZCompElSide> >::iterator itlist = subels.begin(); itlist != subels.end(); itlist++)
            {
                sout << " SUBDOMAIN first " << itlist->first << "\n";
                std::list<TPZCompElSide> &lst = itlist->second;
                for (std::list<TPZCompElSide>::iterator its = lst.begin(); its != lst.end(); its++)
                {
                    sout << " GeoElSide " << its->Reference() << std::endl;
                }
            }
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif
        TPZGeoEl *gel = fGMesh->ElementVec()[elindex];
        int side = gel->NSides()-1;
        TPZCompEl *cel = gel->Reference();
        // intel contains the flux skeleton element
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);

        for (std::map<int64_t,std::list<TPZCompElSide> >::iterator itlist = subels.begin(); itlist != subels.end(); itlist++) {
            std::list<TPZCompElSide> &lst = itlist->second;
            for (std::list<TPZCompElSide>::iterator its = lst.begin(); its != lst.end(); its++) {
                TPZInterpolatedElement *intelsub = dynamic_cast<TPZInterpolatedElement *>(its->Element());
                if (!intelsub) {
                    DebugStop();
                }
                intelsub->RestrainSide(its->Side(), intel, side);
            }
        }
        it++;
    }
    // this will renumber the connects that are now constrained
    fFluxMesh->ExpandSolution();
    fFluxMesh->SetDimModel(meshdim);
}